

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::read_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  pointer pvVar5;
  undefined4 extraout_var;
  reference pvVar6;
  char *pcVar7;
  int local_58;
  int local_54;
  int f2_len;
  int f1_len;
  char *p;
  array<char,_21UL> line;
  char *type_local;
  int *f2_local;
  qpdf_offset_t *f1_local;
  QPDF *this_local;
  
  line._M_elems._13_8_ = type;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  pvVar5 = std::array<char,_21UL>::data((array<char,_21UL> *)((long)&p + 3));
  iVar2 = (*peVar4->_vptr_InputSource[7])(peVar4,pvVar5,0x14);
  if (CONCAT44(extraout_var,iVar2) == 0x14) {
    pvVar6 = std::array<char,_21UL>::operator[]((array<char,_21UL> *)((long)&p + 3),0x14);
    *pvVar6 = '\0';
    _f2_len = std::array<char,_21UL>::data((array<char,_21UL> *)((long)&p + 3));
    local_54 = 0;
    local_58 = 0;
    for (; *_f2_len == '0'; _f2_len = _f2_len + 1) {
      local_54 = local_54 + 1;
    }
    while( true ) {
      iVar2 = local_54;
      bVar1 = ::qpdf::util::is_digit(*_f2_len);
      if (bVar1) {
        local_54 = local_54 + 1;
      }
      if (!bVar1 || 9 < iVar2) break;
      *f1 = *f1 * 10;
      *f1 = (long)(*_f2_len + -0x30) + *f1;
      _f2_len = _f2_len + 1;
    }
    bVar1 = ::qpdf::util::is_space(*_f2_len);
    if (bVar1) {
      while (_f2_len = _f2_len + 1, *_f2_len == '0') {
        local_58 = local_58 + 1;
      }
      while( true ) {
        iVar2 = local_58;
        bVar1 = ::qpdf::util::is_digit(*_f2_len);
        if (bVar1) {
          local_58 = local_58 + 1;
        }
        if (!bVar1 || 4 < iVar2) break;
        *f2 = *f2 * 10;
        *f2 = *_f2_len + -0x30 + *f2;
        _f2_len = _f2_len + 1;
      }
      pcVar7 = _f2_len + 1;
      bVar1 = ::qpdf::util::is_space(*_f2_len);
      if (((bVar1) &&
          (((*pcVar7 == 'f' || (*pcVar7 == 'n')) &&
           (*(char *)line._M_elems._13_8_ = *pcVar7, _f2_len[2] != '\0')))) &&
         ((_f2_len[3] != '\0' &&
          (((_f2_len[3] == '\n' || (_f2_len[3] == '\r')) && ((local_54 == 10 && (local_58 == 5))))))
         )) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = read_bad_xrefEntry(this,f1,f2,(char *)line._M_elems._13_8_);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
QPDF::read_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    std::array<char, 21> line;
    if (m->file->read(line.data(), 20) != 20) {
        // C++20: [[unlikely]]
        return false;
    }
    line[20] = '\0';
    char const* p = line.data();

    int f1_len = 0;
    int f2_len = 0;

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.

    // Gather f1 digits. NB No risk of overflow as 9'999'999'999 < max long long.
    while (*p == '0') {
        ++f1_len;
        ++p;
    }
    while (util::is_digit(*p) && f1_len++ < 10) {
        f1 *= 10;
        f1 += *p++ - '0';
    }
    // Require space
    if (!util::is_space(*p++)) {
        // Entry doesn't start with space or digit.
        // C++20: [[unlikely]]
        return false;
    }
    // Gather digits. NB No risk of overflow as 99'999 < max int.
    while (*p == '0') {
        ++f2_len;
        ++p;
    }
    while (util::is_digit(*p) && f2_len++ < 5) {
        f2 *= 10;
        f2 += static_cast<int>(*p++ - '0');
    }
    if (util::is_space(*p++) && (*p == 'f' || *p == 'n')) {
        // C++20: [[likely]]
        type = *p;
        // No test for valid line[19].
        if (*(++p) && *(++p) && (*p == '\n' || *p == '\r') && f1_len == 10 && f2_len == 5) {
            // C++20: [[likely]]
            return true;
        }
    }
    return read_bad_xrefEntry(f1, f2, type);
}